

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O2

int fy_emit_increase_indent(fy_emitter *emit,int flags,int indent)

{
  uint uVar1;
  uint uVar2;
  
  if (indent < 0) {
    indent = 0;
    if ((flags & 0x10U) != 0) {
      uVar1 = emit->cfg->flags >> 8 & 0xf;
      uVar2 = 2;
      if (uVar1 != 0) {
        uVar2 = uVar1;
      }
      return uVar2;
    }
  }
  else if ((flags & 0x20U) == 0) {
    uVar1 = emit->cfg->flags >> 8 & 0xf;
    uVar2 = 2;
    if (uVar1 != 0) {
      uVar2 = uVar1;
    }
    return indent + uVar2;
  }
  return indent;
}

Assistant:

int fy_emit_increase_indent(struct fy_emitter *emit, int flags, int indent) {
    if (indent < 0)
        return (flags & DDNF_FLOW) ? fy_emit_indent(emit) : 0;

    if (!(flags & DDNF_INDENTLESS))
        return indent + fy_emit_indent(emit);

    return indent;
}